

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

int solve(SatPos *SatposSolver,SPP *SppSolver,ReadData *decoder,ELLIPSOID type,string *path)

{
  pointer pcVar1;
  double dVar2;
  BLH blh;
  XYZ Ref;
  XYZ xyz;
  bool bVar3;
  SPP *pSVar4;
  int iVar5;
  long lVar6;
  SPPResult *pSVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int iVar10;
  byte bVar11;
  SPPResult result;
  Satellite *local_38d0;
  Obs *local_38c8;
  Ephemeris *local_38c0;
  Ephemeris *local_38b8;
  Obs *local_38b0;
  SPP *local_38a8;
  string *local_38a0;
  double local_3898;
  undefined1 *local_3890 [2];
  undefined1 local_3880 [16];
  undefined8 local_3870;
  undefined8 uStack_3868;
  double local_3860;
  Ephemeris *local_3858 [2];
  double local_3848;
  SPPResult local_25a0;
  undefined8 local_12e8 [599];
  
  bVar11 = 0;
  local_38a0 = path;
  SPP::GetResult(&local_25a0,SppSolver);
  if ((local_25a0.UserRefPositionXYZ.X == -1.0) && (!NAN(local_25a0.UserRefPositionXYZ.X))) {
    ReadData::GetUserPos(decoder);
    if ((local_3848 != 0.0) || (NAN(local_3848))) {
      ReadData::GetUserPos(decoder);
      blh.L = (double)uStack_3868;
      blh.B = (double)local_3870;
      blh.H = local_3860;
      BLH2XYZ(blh,type,&local_25a0.UserRefPositionXYZ);
      Ref.Y = local_25a0.UserRefPositionXYZ.Y;
      Ref.X = local_25a0.UserRefPositionXYZ.X;
      Ref.Z = local_25a0.UserRefPositionXYZ.Z;
      SPP::setRefPos(SppSolver,Ref);
    }
  }
  dVar2 = local_25a0.GPSR + local_25a0.BDSR;
  iVar10 = 0xb;
  local_38a8 = SppSolver;
  do {
    iVar10 = iVar10 + -1;
    if (iVar10 == 0) {
      bVar3 = true;
      break;
    }
    local_3898 = dVar2;
    local_3858[0] = ReadData::GetGPSEph(decoder);
    local_38d0 = (Satellite *)ReadData::GetGPSObs(decoder);
    pSVar7 = &local_25a0;
    puVar8 = (undefined8 *)&stack0xffffffffffffb468;
    for (lVar6 = 599; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *(undefined8 *)&pSVar7->ObsTime;
      pSVar7 = (SPPResult *)((long)pSVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    }
    iVar5 = SatPos::CalculateGPSPos(SatposSolver,(SPPResult *)local_3858,&local_38d0);
    if (iVar5 != 0) {
LAB_0010596d:
      bVar3 = false;
      break;
    }
    local_3858[0] = ReadData::GetGPSEph(decoder);
    pSVar7 = &local_25a0;
    puVar8 = (undefined8 *)&stack0xffffffffffffb468;
    for (lVar6 = 599; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *(undefined8 *)&pSVar7->ObsTime;
      pSVar7 = (SPPResult *)((long)pSVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    }
    iVar5 = SatPos::CalculateSatVel(SatposSolver,(SPPResult *)local_3858,0);
    if (iVar5 != 0) goto LAB_0010596d;
    local_3858[0] = ReadData::GetBDSEph(decoder);
    local_38d0 = (Satellite *)ReadData::GetBDSObs(decoder);
    pSVar7 = &local_25a0;
    puVar8 = (undefined8 *)&stack0xffffffffffffb468;
    for (lVar6 = 599; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *(undefined8 *)&pSVar7->ObsTime;
      pSVar7 = (SPPResult *)((long)pSVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    }
    iVar5 = SatPos::CalculateBDSPos(SatposSolver,(SPPResult *)local_3858,&local_38d0);
    if (iVar5 != 0) goto LAB_0010596d;
    local_3858[0] = ReadData::GetBDSEph(decoder);
    pSVar7 = &local_25a0;
    puVar8 = (undefined8 *)&stack0xffffffffffffb468;
    for (lVar6 = 599; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *(undefined8 *)&pSVar7->ObsTime;
      pSVar7 = (SPPResult *)((long)pSVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    }
    iVar5 = SatPos::CalculateSatVel(SatposSolver,(SPPResult *)local_3858,4);
    if (iVar5 != 0) goto LAB_0010596d;
    bVar3 = true;
    local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
    local_38d0 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_38c8 = ReadData::GetGPSObs(decoder);
    local_38b0 = ReadData::GetBDSObs(decoder);
    local_38b8 = ReadData::GetGPSEph(decoder);
    local_38c0 = ReadData::GetBDSEph(decoder);
    pSVar4 = local_38a8;
    iVar5 = SPP::solveSPP(local_38a8,(Satellite **)local_3858,&local_38d0,&local_38c8,&local_38b0,
                          &local_38b8,&local_38c0,type);
    if (iVar5 != 0) {
      bVar3 = false;
      break;
    }
    SPP::GetResult((SPPResult *)local_3858,pSVar4);
    memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
    dVar2 = local_25a0.GPSR + local_25a0.BDSR;
  } while (1e-10 <= ABS(dVar2 - local_3898));
  local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
  local_38d0 = SatPos::GetPosAndVel(SatposSolver,BDS);
  local_38c8 = ReadData::GetGPSObs(decoder);
  local_38b0 = ReadData::GetBDSObs(decoder);
  local_38b8 = ReadData::GetGPSEph(decoder);
  local_38c0 = ReadData::GetBDSEph(decoder);
  pSVar4 = local_38a8;
  SPP::solveSPV(local_38a8,(Satellite **)local_3858,&local_38d0,&local_38c8,&local_38b0,&local_38b8,
                &local_38c0,type);
  SPP::GetResult((SPPResult *)local_3858,pSVar4);
  memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
  if (bVar3) {
    local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
    local_38d0 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_38c8 = ReadData::GetGPSObs(decoder);
    local_38b0 = ReadData::GetBDSObs(decoder);
    local_38b8 = ReadData::GetGPSEph(decoder);
    local_38c0 = ReadData::GetBDSEph(decoder);
    SPP::solveSPV(pSVar4,(Satellite **)local_3858,&local_38d0,&local_38c8,&local_38b0,&local_38b8,
                  &local_38c0,type);
    SPP::GetResult((SPPResult *)local_3858,pSVar4);
    memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
    xyz.Y = local_25a0.UserPositionXYZ.Y;
    xyz.X = local_25a0.UserPositionXYZ.X;
    xyz.Z = local_25a0.UserPositionXYZ.Z;
    operator<<((ostream *)&std::cout,xyz);
    memcpy(local_12e8,&local_25a0,0x12b8);
    pcVar1 = (local_38a0->_M_dataplus)._M_p;
    local_3890[0] = local_3880;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3890,pcVar1,pcVar1 + local_38a0->_M_string_length);
    puVar8 = local_12e8;
    puVar9 = (undefined8 *)&stack0xffffffffffffb468;
    for (lVar6 = 599; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    }
    WriteToFile((string *)local_3890);
    if (local_3890[0] != local_3880) {
      operator_delete(local_3890[0]);
    }
    ReadData::ResetObs(decoder);
  }
  return 0;
}

Assistant:

int solve(SatPos &SatposSolver, SPP &SppSolver, ReadData &decoder, ELLIPSOID type, string path) {
    SPPResult result = SppSolver.GetResult();
    if(result.UserRefPositionXYZ.X == -1 && decoder.GetUserPos().H != 0) {
        BLH2XYZ(decoder.GetUserPos(), type, result.UserRefPositionXYZ);
        SppSolver.setRefPos(result.UserRefPositionXYZ);
    }
    // if(SppSolver.re)
    double dt0 = result.GPSR + result.BDSR;
    int count = 0;
    int flag;
    // SATTIME obs;
    while(count < 10)
    {
        flag = SatposSolver.CalculateGPSPos(decoder.GetGPSEph(), decoder.GetGPSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetGPSEph(), GPS, result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateBDSPos(decoder.GetBDSEph(), decoder.GetBDSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetBDSEph(), BDS, result);
        if(flag != 0)
            break;
        flag = SppSolver.solveSPP(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);

        if(flag != 0)
            break;
        result = SppSolver.GetResult();
        double dt1 = result.GPSR + result.BDSR;
        if(abs(dt1 - dt0) < 1e-10)
        {
            break;
        }
        dt0 = dt1;
        count ++;
    } 
    SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                        decoder.GetGPSObs(), decoder.GetBDSObs(), 
                        decoder.GetGPSEph(), decoder.GetBDSEph(), type);
    result = SppSolver.GetResult();
    if(flag == 0) {
        SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);
        result = SppSolver.GetResult();

        cout << result.UserPositionXYZ;
        WriteToFile(result, path);
        decoder.ResetObs();
    }
    return 0;
}